

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O0

int ssl_cert_cache_chain_certs(CERT *cert)

{
  bool bVar1;
  enable_if_t<_internal::StackTraits<stack_st_X509>::kIsConst,_bool> eVar2;
  pointer psVar3;
  size_t sVar4;
  stack_st_X509 *__p;
  X509 *__p_00;
  pointer psVar5;
  byte local_89;
  unique_ptr<x509_st,_bssl::internal::Deleter> local_60;
  unique_ptr<x509_st,_bssl::internal::Deleter> local_58;
  UniquePtr<X509> x509;
  CRYPTO_BUFFER *buffer;
  size_t local_38;
  size_t i;
  unique_ptr<stack_st_X509,_bssl::internal::Deleter> local_28;
  UniquePtr<struct_stack_st_X509> chain;
  SSL_CREDENTIAL *cred;
  CERT *cert_local;
  
  if (cert->x509_method == (SSL_X509_METHOD *)0x0) {
    __assert_fail("cert->x509_method",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_x509.cc"
                  ,0x2e6,"int ssl_cert_cache_chain_certs(CERT *)");
  }
  chain._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)
       std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::get(&cert->legacy_credential);
  if ((cert->x509_chain == (stack_st_X509 *)0x0) &&
     (bVar1 = std::operator==((UniquePtr<struct_stack_st_CRYPTO_BUFFER> *)
                              ((long)chain._M_t.
                                     super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl +
                              0x30),(nullptr_t)0x0), !bVar1)) {
    psVar3 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get
                       ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                        ((long)chain._M_t.
                               super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl + 0x30));
    sVar4 = sk_CRYPTO_BUFFER_num(psVar3);
    if (1 < sVar4) {
      __p = sk_X509_new_null();
      std::unique_ptr<stack_st_X509,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<stack_st_X509,bssl::internal::Deleter> *)&local_28,__p);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28);
      if (bVar1) {
        local_38 = 1;
        while( true ) {
          psVar3 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get
                             ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                              ((long)chain._M_t.
                                     super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl +
                              0x30));
          sVar4 = sk_CRYPTO_BUFFER_num(psVar3);
          if (sVar4 <= local_38) break;
          psVar3 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get
                             ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                              ((long)chain._M_t.
                                     super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl +
                              0x30));
          x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
               sk_CRYPTO_BUFFER_value(psVar3,local_38);
          __p_00 = X509_parse_from_buffer
                             ((CRYPTO_BUFFER *)
                              x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t
                              .super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
          std::unique_ptr<x509_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<x509_st,bssl::internal::Deleter> *)&local_58,__p_00);
          bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_58);
          local_89 = 1;
          if (bVar1) {
            psVar5 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get(&local_28);
            std::unique_ptr<x509_st,_bssl::internal::Deleter>::unique_ptr(&local_60,&local_58);
            eVar2 = bssl::PushToStack<stack_st_X509>(psVar5,&local_60);
            local_89 = eVar2 ^ 0xff;
            std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_60);
          }
          bVar1 = (local_89 & 1) != 0;
          if (bVar1) {
            cert_local._4_4_ = 0;
          }
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_58);
          if (bVar1) goto LAB_001bd482;
          local_38 = local_38 + 1;
        }
        psVar5 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::release(&local_28);
        cert->x509_chain = psVar5;
        cert_local._4_4_ = 1;
      }
      else {
        cert_local._4_4_ = 0;
      }
LAB_001bd482:
      std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&local_28);
      return cert_local._4_4_;
    }
  }
  return 1;
}

Assistant:

static int ssl_cert_cache_chain_certs(CERT *cert) {
  assert(cert->x509_method);

  const SSL_CREDENTIAL *cred = cert->legacy_credential.get();
  if (cert->x509_chain != nullptr || cred->chain == nullptr ||
      sk_CRYPTO_BUFFER_num(cred->chain.get()) < 2) {
    return 1;
  }

  UniquePtr<STACK_OF(X509)> chain(sk_X509_new_null());
  if (!chain) {
    return 0;
  }

  for (size_t i = 1; i < sk_CRYPTO_BUFFER_num(cred->chain.get()); i++) {
    CRYPTO_BUFFER *buffer = sk_CRYPTO_BUFFER_value(cred->chain.get(), i);
    UniquePtr<X509> x509(X509_parse_from_buffer(buffer));
    if (!x509 ||  //
        !PushToStack(chain.get(), std::move(x509))) {
      return 0;
    }
  }

  cert->x509_chain = chain.release();
  return 1;
}